

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall UnionType::UnionType(UnionType *this,string *name)

{
  undefined8 *in_RDI;
  string *unaff_retaddr;
  
  AggregateType::AggregateType(&this->super_AggregateType,name._4_4_,unaff_retaddr);
  *in_RDI = &PTR__UnionType_00300810;
  return;
}

Assistant:

UnionType::UnionType(const std::string& name) : AggregateType(TK_UnionType, name) {}